

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O3

int __thiscall
zmq::timers_t::add(timers_t *this,size_t interval_,timers_timer_fn *handler_,void *arg_)

{
  uint64_t uVar1;
  int *piVar2;
  int iVar3;
  pair<const_unsigned_long,_zmq::timers_t::timer_t> local_50;
  
  if (handler_ == (timers_timer_fn *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    iVar3 = -1;
  }
  else {
    uVar1 = clock_t::now_ms(&this->_clock);
    local_50.first = uVar1 + interval_;
    iVar3 = this->_next_timer_id + 1;
    this->_next_timer_id = iVar3;
    local_50.second.timer_id = iVar3;
    local_50.second.interval = interval_;
    local_50.second.handler = handler_;
    local_50.second.arg = arg_;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,zmq::timers_t::timer_t>,std::_Select1st<std::pair<unsigned_long_const,zmq::timers_t::timer_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,zmq::timers_t::timer_t>>>
    ::_M_insert_equal<std::pair<unsigned_long_const,zmq::timers_t::timer_t>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,zmq::timers_t::timer_t>,std::_Select1st<std::pair<unsigned_long_const,zmq::timers_t::timer_t>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,zmq::timers_t::timer_t>>>
                *)&this->_timers,&local_50);
  }
  return iVar3;
}

Assistant:

int zmq::timers_t::add (size_t interval_, timers_timer_fn handler_, void *arg_)
{
    if (handler_ == NULL) {
        errno = EFAULT;
        return -1;
    }

    uint64_t when = _clock.now_ms () + interval_;
    timer_t timer = {++_next_timer_id, interval_, handler_, arg_};
    _timers.insert (timersmap_t::value_type (when, timer));

    return timer.timer_id;
}